

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O0

void __thiscall OpenMD::NVT::NVT(NVT *this,SimInfo *info)

{
  bool bVar1;
  SnapshotManager *this_00;
  undefined8 *in_RDI;
  RealType RVar2;
  Snapshot *snap;
  Globals *simParams;
  SimInfo *in_stack_ffffffffffffff28;
  Snapshot *in_stack_ffffffffffffff30;
  
  VelocityVerletIntegrator::VelocityVerletIntegrator
            ((VelocityVerletIntegrator *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *in_RDI = &PTR__NVT_00508398;
  *(undefined4 *)(in_RDI + 0x1f) = 4;
  in_RDI[0x22] = 0x3eb0c6f7a0b5ed8d;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x219ccc)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x219ce2)
  ;
  SimInfo::getSimParams((SimInfo *)in_RDI[0xe]);
  bVar1 = Globals::getUseIntialExtendedSystemState((Globals *)0x219d17);
  if (!bVar1) {
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0xe]);
    SnapshotManager::getCurrentSnapshot(this_00);
    std::make_pair<double,double>
              ((double *)in_stack_ffffffffffffff30,(double *)in_stack_ffffffffffffff28);
    Snapshot::setThermostat
              (in_stack_ffffffffffffff30,(pair<double,_double> *)in_stack_ffffffffffffff28);
  }
  bVar1 = Globals::haveTargetTemp((Globals *)0x219e1e);
  if (bVar1) {
    RVar2 = Globals::getTargetTemp((Globals *)0x219e7c);
    in_RDI[0x20] = RVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,"You can\'t use the NVT integrator without a targetTemp_!\n");
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  bVar1 = Globals::haveTauThermostat((Globals *)0x219ea4);
  if (bVar1) {
    in_stack_ffffffffffffff30 = (Snapshot *)Globals::getTauThermostat((Globals *)0x219f02);
    in_RDI[0x21] = in_stack_ffffffffffffff30;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "If you use the constant temperature\n\tintegrator, you must set tauThermostat.\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  Integrator::updateSizes((Integrator *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

NVT::NVT(SimInfo* info) :
      VelocityVerletIntegrator(info), maxIterNum_(4), chiTolerance_(1e-6) {
    Globals* simParams = info_->getSimParams();

    if (!simParams->getUseIntialExtendedSystemState()) {
      Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
      snap->setThermostat(make_pair(0.0, 0.0));
    }

    if (!simParams->haveTargetTemp()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "You can't use the NVT integrator without a targetTemp_!\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    } else {
      targetTemp_ = simParams->getTargetTemp();
    }

    // We must set tauThermostat.

    if (!simParams->haveTauThermostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the constant temperature\n"
               "\tintegrator, you must set tauThermostat.\n");

      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauThermostat_ = simParams->getTauThermostat();
    }

    updateSizes();
  }